

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::values::abstract_value<bool>::~abstract_value(abstract_value<bool> *this)

{
  code *pcVar1;
  abstract_value<bool> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~abstract_value() override = default;